

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

int csguide_webserver::CheckBasePath(string *base_path)

{
  int iVar1;
  Logger *pLVar2;
  allocator local_c1;
  string local_c0;
  stat file;
  
  iVar1 = stat((base_path->_M_dataplus)._M_p,(stat *)&file);
  if (iVar1 == -1) {
    pLVar2 = Logger::GetInstance();
    std::__cxx11::string::string((string *)&local_c0,"path not exist: %s",&local_c1);
    Logger::LogErr<char_const*>(pLVar2,&local_c0,(base_path->_M_dataplus)._M_p);
  }
  else {
    if (((file.st_mode & 0xf000) == 0x4000) &&
       (iVar1 = access((base_path->_M_dataplus)._M_p,4), iVar1 != -1)) {
      return 0;
    }
    pLVar2 = Logger::GetInstance();
    std::__cxx11::string::string
              ((string *)&local_c0,"path not directory or can\'t access: %s",&local_c1);
    Logger::LogErr<char_const*>(pLVar2,&local_c0,(base_path->_M_dataplus)._M_p);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  return -1;
}

Assistant:

int CheckBasePath(const std::string &base_path) {
  struct stat file;
  if (stat(base_path.c_str(), &file) == -1) {
    Logger::GetInstance().LogErr("path not exist: %s", base_path.c_str());
    return -1;
  }
  // 不是目录 或者不可访问
  if (!S_ISDIR(file.st_mode) || access(base_path.c_str(), R_OK) == -1) {
    Logger::GetInstance().LogErr("path not directory or can't access: %s", base_path.c_str());
    return -1;
  }
  return 0;
}